

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_dc_predictor_8x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  long lVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  lVar10 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  do {
    uVar1 = *(ulong *)(above + lVar10);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar4._8_2_ = (short)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._10_4_ = auVar2._10_4_;
    auVar8._6_8_ = 0;
    auVar8._0_6_ = auVar4._8_6_;
    auVar6._4_2_ = (short)(uVar1 >> 0x10);
    auVar6._0_4_ = (uint)uVar1;
    auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
    iVar13 = iVar13 + ((uint)uVar1 & 0xffff);
    iVar14 = iVar14 + auVar6._4_4_;
    iVar15 = iVar15 + auVar4._8_4_;
    iVar16 = iVar16 + (auVar2._10_4_ >> 0x10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 8);
  uVar1 = *(ulong *)left;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3._12_2_ = (short)(uVar1 >> 0x30);
  auVar5._8_2_ = (short)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._10_4_ = auVar3._10_4_;
  auVar9._6_8_ = 0;
  auVar9._0_6_ = auVar5._8_6_;
  auVar7._4_2_ = (short)(uVar1 >> 0x10);
  auVar7._0_4_ = (uint)uVar1;
  auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
  auVar12 = ZEXT416(((auVar3._10_4_ >> 0x10) + auVar7._4_4_ +
                     auVar5._8_4_ + iVar16 + iVar14 + iVar15 + iVar13 + ((uint)uVar1 & 0xffff) + 6
                    >> 2) * 0xaaab >> 0x11);
  auVar12 = pshuflw(auVar12,auVar12,0);
  uVar11 = auVar12._0_4_;
  iVar13 = 4;
  do {
    *(undefined4 *)dst = uVar11;
    *(undefined4 *)(dst + 2) = uVar11;
    *(undefined4 *)(dst + 4) = uVar11;
    *(undefined4 *)(dst + 6) = uVar11;
    dst = dst + stride;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_8x4_c(uint16_t *dst, ptrdiff_t stride,
                                   const uint16_t *above, const uint16_t *left,
                                   int bd) {
  highbd_dc_predictor_rect(dst, stride, 8, 4, above, left, bd, 2,
                           HIGHBD_DC_MULTIPLIER_1X2);
}